

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

PtrTokenOrSyntax * __thiscall
slang::syntax::ParenthesizedSequenceExprSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,ParenthesizedSequenceExprSyntax *this,
          size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (ParenthesizedSequenceExprSyntax *)0x0:
    pPVar1 = __return_storage_ptr__ + 1;
    goto LAB_001a8521;
  case (ParenthesizedSequenceExprSyntax *)0x1:
    pPVar1 = *(PtrTokenOrSyntax **)
              ((long)&__return_storage_ptr__[2].
                      super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
              + 8);
    break;
  case (ParenthesizedSequenceExprSyntax *)0x2:
    pPVar1 = *(PtrTokenOrSyntax **)
              &__return_storage_ptr__[3].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
    break;
  case (ParenthesizedSequenceExprSyntax *)0x3:
    pPVar1 = __return_storage_ptr__ + 3;
LAB_001a8521:
    return (PtrTokenOrSyntax *)
           (__index_type *)
           ((long)&(pPVar1->super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>).
                   super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> + 8)
    ;
  case (ParenthesizedSequenceExprSyntax *)0x4:
    pPVar1 = *(PtrTokenOrSyntax **)
              ((long)&__return_storage_ptr__[4].
                      super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
              + 8);
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax ParenthesizedSequenceExprSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &openParen;
        case 1: return expr.get();
        case 2: return matchList;
        case 3: return &closeParen;
        case 4: return repetition;
        default: return nullptr;
    }
}